

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_inspect_cell(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_INT *pRVar3;
  REF_INT RVar4;
  REF_GRID pRVar5;
  long lVar6;
  REF_INT cell_edge;
  long lVar7;
  
  pRVar5 = ref_subdiv->grid;
  pRVar2 = pRVar5->node;
  if (0 < ref_cell->edge_per) {
    cell_edge = 0;
    do {
      pRVar3 = ref_subdiv->mark;
      RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,cell_edge,cell);
      printf(" %d",(ulong)(uint)pRVar3[RVar4]);
      cell_edge = cell_edge + 1;
    } while (cell_edge < ref_cell->edge_per);
    pRVar5 = ref_subdiv->grid;
  }
  printf(" cell %d rank %d",(ulong)(uint)cell,(ulong)(uint)pRVar5->mpi->id);
  if (0 < ref_cell->node_per) {
    lVar7 = 0;
    do {
      iVar1 = ref_cell->c2n[(long)ref_cell->size_per * (long)cell + lVar7];
      lVar6 = -1;
      if ((-1 < (long)iVar1) && (iVar1 < pRVar2->max)) {
        lVar6 = pRVar2->global[iVar1];
        if (lVar6 < 0) {
          lVar6 = -1;
        }
      }
      printf(" %ld",lVar6);
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 < ref_cell->node_per);
  }
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect_cell(REF_SUBDIV ref_subdiv,
                                           REF_CELL ref_cell, REF_INT cell) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_INT cell_node, edge;

  for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++) {
    printf(" %d",
           ref_subdiv_mark(ref_subdiv,
                           ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell)));
  }
  printf(" cell %d rank %d", cell, ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)));
  each_ref_cell_cell_node(ref_cell, cell_node) {
    printf(" " REF_GLOB_FMT,
           ref_node_global(ref_node, ref_cell_c2n(ref_cell, cell_node, cell)));
  }
  printf("\n");

  return REF_SUCCESS;
}